

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall cfd::core::ByteData256::ByteData256(ByteData256 *this)

{
  uchar *__s;
  size_type __n;
  allocator<unsigned_char> local_11;
  ByteData256 *local_10;
  ByteData256 *this_local;
  
  local_10 = this;
  ::std::allocator<unsigned_char>::allocator(&local_11);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,0x20,&local_11);
  ::std::allocator<unsigned_char>::~allocator(&local_11);
  __s = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  __n = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  memset(__s,0,__n);
  return;
}

Assistant:

ByteData256::ByteData256() : data_(std::vector<uint8_t>(kByteData256Length)) {
  memset(data_.data(), 0, data_.size());
}